

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ListOverlay.cpp
# Opt level: O2

void __thiscall cursespp::ListOverlay::~ListOverlay(ListOverlay *this)

{
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IOrderable.
  _vptr_IOrderable = (_func_int **)&PTR__ListOverlay_001c0010;
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IDisplayable.
  _vptr_IDisplayable = (_func_int **)&DAT_001c0298;
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IMouseHandler.
  _vptr_IMouseHandler = (_func_int **)&PTR__ListOverlay_001c02c8;
  (this->super_OverlayBase).super_LayoutBase.super_Window.super_IWindow.super_IMessageTarget.
  _vptr_IMessageTarget = (_func_int **)&PTR__ListOverlay_001c02f0;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IWindowGroup._vptr_IWindowGroup =
       (_func_int **)&PTR__ListOverlay_001c0318;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IKeyHandler._vptr_IKeyHandler =
       (_func_int **)&PTR__ListOverlay_001c03c0;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IMouseHandler._vptr_IMouseHandler =
       (_func_int **)&PTR__ListOverlay_001c03e8;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IOrderable._vptr_IOrderable =
       (_func_int **)&PTR__ListOverlay_001c0410;
  (this->super_OverlayBase).super_LayoutBase.super_ILayout.super_IDisplayable._vptr_IDisplayable =
       (_func_int **)&PTR__ListOverlay_001c0440;
  (this->super_OverlayBase).super_IOverlay._vptr_IOverlay = (_func_int **)&PTR__ListOverlay_001c0470
  ;
  (this->super_has_slots<sigslot::multi_threaded_local>).super_multi_threaded_local.
  _vptr_multi_threaded_local = (_func_int **)&PTR__ListOverlay_001c0498;
  CustomListWindow::Reset
            ((this->listWindow).
             super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr);
  std::_Function_base::~_Function_base(&(this->keyInterceptorCallback).super__Function_base);
  std::_Function_base::~_Function_base(&(this->dismissedCallback).super__Function_base);
  std::_Function_base::~_Function_base(&(this->deleteKeyCallback).super__Function_base);
  std::_Function_base::~_Function_base(&(this->itemSelectedCallback).super__Function_base);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->scrollbar).super___shared_ptr<cursespp::Window,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->listWindow).
              super___shared_ptr<cursespp::ListOverlay::CustomListWindow,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->adapter).
              super___shared_ptr<cursespp::IScrollAdapter,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&this->title);
  sigslot::has_slots<sigslot::multi_threaded_local>::~has_slots
            (&this->super_has_slots<sigslot::multi_threaded_local>);
  OverlayBase::~OverlayBase(&this->super_OverlayBase);
  return;
}

Assistant:

ListOverlay::~ListOverlay() {
    this->listWindow->Reset();
}